

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O3

int mbedtls_rsa_parse_key(mbedtls_rsa_context *rsa,uchar *key,size_t keylen)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  uchar *end;
  uchar *p;
  mbedtls_mpi T;
  int version;
  size_t len;
  uchar *local_48;
  mbedtls_mpi local_40;
  int local_2c;
  size_t local_28;
  
  mbedtls_mpi_init(&local_40);
  end = key + keylen;
  local_48 = key;
  iVar1 = mbedtls_asn1_get_tag(&local_48,end,&local_28,0x30);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (end != local_48 + local_28) {
    return -0x4080;
  }
  iVar1 = mbedtls_asn1_get_int(&local_48,end,&local_2c);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (local_2c != 0) {
    return -0x4080;
  }
  iVar1 = asn1_get_nonzero_mpi(&local_48,end,&local_40);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_copy(&rsa->N,&local_40);
    if (iVar1 == 0) {
      sVar3 = mbedtls_mpi_size(&rsa->N);
      rsa->len = sVar3;
LAB_0187889e:
      iVar1 = asn1_get_nonzero_mpi(&local_48,end,&local_40);
      if (iVar1 != 0) goto LAB_01878859;
      iVar2 = mbedtls_mpi_copy(&rsa->E,&local_40);
      iVar1 = iVar2 + -0x4080;
      if (iVar1 != 0 && iVar2 != 0) goto LAB_01878a66;
      iVar1 = asn1_get_nonzero_mpi(&local_48,end,&local_40);
      if (iVar1 != 0) goto LAB_01878859;
      iVar2 = mbedtls_mpi_copy(&rsa->D,&local_40);
      iVar1 = iVar2 + -0x4080;
      if (iVar1 != 0 && iVar2 != 0) goto LAB_01878a66;
      iVar1 = asn1_get_nonzero_mpi(&local_48,end,&local_40);
      if (iVar1 != 0) goto LAB_01878859;
      iVar2 = mbedtls_mpi_copy(&rsa->P,&local_40);
      iVar1 = iVar2 + -0x4080;
      if (iVar1 != 0 && iVar2 != 0) goto LAB_01878a66;
      iVar1 = asn1_get_nonzero_mpi(&local_48,end,&local_40);
      if (iVar1 != 0) goto LAB_01878859;
      iVar2 = mbedtls_mpi_copy(&rsa->Q,&local_40);
      iVar1 = iVar2 + -0x4080;
      if (iVar1 != 0 && iVar2 != 0) goto LAB_01878a66;
      iVar1 = asn1_get_nonzero_mpi(&local_48,end,&local_40);
      if ((((((iVar1 != 0) || (iVar1 = mbedtls_mpi_copy(&rsa->DP,&local_40), iVar1 != 0)) ||
            (iVar1 = asn1_get_nonzero_mpi(&local_48,end,&local_40), iVar1 != 0)) ||
           ((iVar1 = mbedtls_mpi_copy(&rsa->DQ,&local_40), iVar1 != 0 ||
            (iVar1 = asn1_get_nonzero_mpi(&local_48,end,&local_40), iVar1 != 0)))) ||
          ((iVar1 = mbedtls_mpi_copy(&rsa->QP,&local_40), iVar1 != 0 ||
           ((iVar1 = mbedtls_rsa_complete(rsa), iVar1 != 0 ||
            (iVar1 = mbedtls_rsa_check_pubkey(rsa), iVar1 != 0)))))) ||
         (iVar1 = -0x66, local_48 != end)) goto LAB_01878859;
      mbedtls_mpi_free(&local_40);
    }
    else {
      iVar1 = iVar1 + -0x4080;
      if (iVar1 == 0) goto LAB_0187889e;
LAB_01878a66:
      mbedtls_mpi_free(&local_40);
      if (iVar1 != 0) goto LAB_01878863;
    }
    iVar1 = 0;
  }
  else {
LAB_01878859:
    mbedtls_mpi_free(&local_40);
LAB_01878863:
    mbedtls_rsa_free(rsa);
  }
  return iVar1;
}

Assistant:

int mbedtls_rsa_parse_key(mbedtls_rsa_context *rsa, const unsigned char *key, size_t keylen)
{
    int ret, version;
    size_t len;
    unsigned char *p, *end;

    mbedtls_mpi T;
    mbedtls_mpi_init(&T);

    p = (unsigned char *) key;
    end = p + keylen;

    /*
     * This function parses the RSAPrivateKey (PKCS#1)
     *
     *  RSAPrivateKey ::= SEQUENCE {
     *      version           Version,
     *      modulus           INTEGER,  -- n
     *      publicExponent    INTEGER,  -- e
     *      privateExponent   INTEGER,  -- d
     *      prime1            INTEGER,  -- p
     *      prime2            INTEGER,  -- q
     *      exponent1         INTEGER,  -- d mod (p-1)
     *      exponent2         INTEGER,  -- d mod (q-1)
     *      coefficient       INTEGER,  -- (inverse of q) mod p
     *      otherPrimeInfos   OtherPrimeInfos OPTIONAL
     *  }
     */
    if ((ret = mbedtls_asn1_get_tag(&p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return ret;
    }

    if (end != p + len) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    if ((ret = mbedtls_asn1_get_int(&p, end, &version)) != 0) {
        return ret;
    }

    if (version != 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    /* Import N */
    if ((ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = mbedtls_rsa_import(rsa, &T, NULL, NULL,
                                  NULL, NULL)) != 0) {
        goto cleanup;
    }

    /* Import E */
    if ((ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = mbedtls_rsa_import(rsa, NULL, NULL, NULL,
                                  NULL, &T)) != 0) {
        goto cleanup;
    }

    /* Import D */
    if ((ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = mbedtls_rsa_import(rsa, NULL, NULL, NULL,
                                  &T, NULL)) != 0) {
        goto cleanup;
    }

    /* Import P */
    if ((ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = mbedtls_rsa_import(rsa, NULL, &T, NULL,
                                  NULL, NULL)) != 0) {
        goto cleanup;
    }

    /* Import Q */
    if ((ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = mbedtls_rsa_import(rsa, NULL, NULL, &T,
                                  NULL, NULL)) != 0) {
        goto cleanup;
    }

#if !defined(MBEDTLS_RSA_NO_CRT) && !defined(MBEDTLS_RSA_ALT)
    /*
     * The RSA CRT parameters DP, DQ and QP are nominally redundant, in
     * that they can be easily recomputed from D, P and Q. However by
     * parsing them from the PKCS1 structure it is possible to avoid
     * recalculating them which both reduces the overhead of loading
     * RSA private keys into memory and also avoids side channels which
     * can arise when computing those values, since all of D, P, and Q
     * are secret. See https://eprint.iacr.org/2020/055 for a
     * description of one such attack.
     */

    /* Import DP */
    if ((ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = mbedtls_mpi_copy(&rsa->DP, &T)) != 0) {
        goto cleanup;
    }

    /* Import DQ */
    if ((ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = mbedtls_mpi_copy(&rsa->DQ, &T)) != 0) {
        goto cleanup;
    }

    /* Import QP */
    if ((ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = mbedtls_mpi_copy(&rsa->QP, &T)) != 0) {
        goto cleanup;
    }

#else
    /* Verify existence of the CRT params */
    if ((ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0) {
        goto cleanup;
    }
#endif

    /* rsa_complete() doesn't complete anything with the default
     * implementation but is still called:
     * - for the benefit of alternative implementation that may want to
     *   pre-compute stuff beyond what's provided (eg Montgomery factors)
     * - as is also sanity-checks the key
     *
     * Furthermore, we also check the public part for consistency with
     * mbedtls_pk_parse_pubkey(), as it includes size minima for example.
     */
    if ((ret = mbedtls_rsa_complete(rsa)) != 0 ||
        (ret = mbedtls_rsa_check_pubkey(rsa)) != 0) {
        goto cleanup;
    }

    if (p != end) {
        ret = MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
    }

cleanup:

    mbedtls_mpi_free(&T);

    if (ret != 0) {
        mbedtls_rsa_free(rsa);
    }

    return ret;
}